

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

void __thiscall VFS::CVFS::CVFSFile::Clear(CVFSFile *this)

{
  mutex *__mutex;
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  std::mutex::lock(__mutex);
  std::
  vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
  ::clear(&this->m_Data);
  ReserveChunks(this,4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void Clear()
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        m_Data.clear();
                        ReserveChunks(4);
                    }